

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::helpEvent(QGraphicsScene *this,QGraphicsSceneHelpEvent *helpEvent)

{
  QGraphicsScenePrivate *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QGraphicsItem **ppQVar5;
  int iVar6;
  QWidget *pQVar7;
  long lVar8;
  long lVar9;
  QGraphicsItem *item;
  long in_FS_OFFSET;
  QPointF QVar10;
  QString local_98;
  QPoint local_80;
  QString local_78;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)QGraphicsSceneHelpEvent::screenPos(helpEvent);
  QVar10 = QGraphicsSceneHelpEvent::scenePos(helpEvent);
  local_78.d.d = (Data *)QVar10.xp;
  local_78.d.ptr = (char16_t *)QVar10.yp;
  pQVar7 = QGraphicsSceneEvent::widget(&helpEvent->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition
            (&local_58,this_00,(QPoint *)&local_98,(QPointF *)&local_78,pQVar7);
  ppQVar5 = local_58.d.ptr;
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    lVar8 = local_58.d.size << 3;
    lVar9 = 0;
    do {
      item = *(QGraphicsItem **)((long)ppQVar5 + lVar9);
      iVar6 = (*((item->d_ptr).d)->_vptr_QGraphicsItemPrivate[7])();
      if ((char)iVar6 != '\0') {
        sendEvent(this,item,(QEvent *)helpEvent);
        if ((helpEvent->super_QGraphicsSceneEvent).field_0xc != '\0') goto LAB_00609623;
      }
      QGraphicsItem::toolTip(&local_78,item);
      qVar2 = local_78.d.size;
      if ((QPoint)local_78.d.d != (QPoint)0x0) {
        LOCK();
        *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
        UNLOCK();
        if (*(int *)local_78.d.d == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (qVar2 != 0) goto LAB_00609506;
      lVar9 = lVar9 + 8;
    } while (lVar8 != lVar9);
  }
  item = (QGraphicsItem *)0x0;
LAB_00609506:
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  local_80.xp.m_i = 0;
  local_80.yp.m_i = 0;
  if (item != (QGraphicsItem *)0x0) {
    QGraphicsItem::toolTip(&local_98,item);
    qVar2 = local_98.d.size;
    if ((QPoint)local_98.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
      UNLOCK();
      if (*(int *)local_98.d.d == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (qVar2 != 0) {
      QGraphicsItem::toolTip(&local_98,item);
      pcVar4 = local_78.d.ptr;
      pDVar3 = local_78.d.d;
      qVar2 = local_98.d.size;
      pDVar1 = local_98.d.d;
      local_98.d.d = local_78.d.d;
      local_78.d.d = pDVar1;
      local_78.d.ptr = local_98.d.ptr;
      local_98.d.ptr = pcVar4;
      local_98.d.size = local_78.d.size;
      local_78.d.size = qVar2;
      if ((QPoint)pDVar3 != (QPoint)0x0) {
        LOCK();
        *(int *)pDVar3 = *(int *)pDVar3 + -1;
        UNLOCK();
        if (*(int *)pDVar3 == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      local_80 = QGraphicsSceneHelpEvent::screenPos(helpEvent);
    }
  }
  pQVar7 = QGraphicsSceneEvent::widget(&helpEvent->super_QGraphicsSceneEvent);
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0xffffffffffffffff;
  QToolTip::showText(&local_80,&local_78,pQVar7,(QRect *)&local_98,-1);
  (**(code **)(*(long *)&helpEvent->super_QGraphicsSceneEvent + 0x10))
            (helpEvent,local_78.d.size != 0);
  if ((QPoint)local_78.d.d != (QPoint)0x0) {
    LOCK();
    *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
    UNLOCK();
    if (*(int *)local_78.d.d == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00609623:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::helpEvent(QGraphicsSceneHelpEvent *helpEvent)
{
#if !QT_CONFIG(tooltip)
    Q_UNUSED(helpEvent);
#else
    // Find the first item that does tooltips
    Q_D(QGraphicsScene);
    const QList<QGraphicsItem *> itemsAtPos = d->itemsAtPosition(helpEvent->screenPos(),
                                                                 helpEvent->scenePos(),
                                                                 helpEvent->widget());
    QGraphicsItem *toolTipItem = nullptr;
    for (auto item : itemsAtPos) {
        if (item->d_func()->isProxyWidget()) {
            // if the item is a proxy widget, the event is forwarded to it
            sendEvent(item, helpEvent);
            if (helpEvent->isAccepted())
                return;
        }
        if (!item->toolTip().isEmpty()) {
            toolTipItem = item;
            break;
        }
    }

    // Show or hide the tooltip
    QString text;
    QPoint point;
    if (toolTipItem && !toolTipItem->toolTip().isEmpty()) {
        text = toolTipItem->toolTip();
        point = helpEvent->screenPos();
    }
    QToolTip::showText(point, text, helpEvent->widget());
    helpEvent->setAccepted(!text.isEmpty());
#endif
}